

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12Texture.cpp
# Opt level: O2

uint32_t __thiscall
GmmLib::GmmGen12TextureCalc::Get2DMipMapHeight(GmmGen12TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo)

{
  uint UnitAlignment;
  anon_struct_8_44_94931171_for_Info aVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  GMM_PLATFORM_INFO *pGVar4;
  undefined4 extraout_var;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint32_t local_60;
  uint32_t local_5c;
  uint32_t CompressWidth;
  uint32_t CompressDepth;
  ulong local_50;
  GMM_PLATFORM_INFO *local_48;
  uint32_t local_3c;
  uint local_38;
  uint8_t local_31;
  uint32_t CompressHeight;
  
  pGVar4 = GmmGetPlatformInfo((this->super_GmmGen11TextureCalc).super_GmmGen10TextureCalc.
                              super_GmmGen9TextureCalc.super_GmmTextureCalc.pGmmLibContext);
  local_31 = GmmIsCompressed((this->super_GmmGen11TextureCalc).super_GmmGen10TextureCalc.
                             super_GmmGen9TextureCalc.super_GmmTextureCalc.pGmmLibContext,
                             pTexInfo->Format);
  uVar2 = pTexInfo->BaseHeight;
  local_3c = pTexInfo->MaxLod;
  UnitAlignment = (pTexInfo->Alignment).VAlign;
  GmmTextureCalc::GetCompressionBlockDimensions
            ((GmmTextureCalc *)this,pTexInfo->Format,&local_60,&local_38,&local_5c);
  if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) == 0) {
    uVar3 = 1;
  }
  else {
    uVar3 = (pTexInfo->MSAA).NumSamples;
  }
  uVar2 = GmmTextureCalc::ExpandHeight((GmmTextureCalc *)this,uVar2,UnitAlignment,uVar3);
  _CompressWidth = CONCAT44(extraout_var,uVar2);
  if (local_31 != '\0') {
    _CompressWidth = (ulong)uVar2 / (ulong)local_38;
  }
  if (((*(ushort *)&(pTexInfo->Flags).Info.field_0x4 & 0x1060) == 0) ||
     (((pTexInfo->Alignment).MipTailStartLod != 0 && (pTexInfo->MaxLod != 0)))) {
    uVar7 = 0;
    uVar6 = 0;
    local_50 = (ulong)UnitAlignment;
    local_48 = pGVar4;
    for (uVar5 = 1; aVar1 = (pTexInfo->Flags).Info, uVar5 <= local_3c; uVar5 = uVar5 + 1) {
      if ((((ulong)aVar1 & 0x106000000000) != 0) && (uVar5 == (pTexInfo->Alignment).MipTailStartLod)
         ) {
        uVar2 = local_48->TileInfo[pTexInfo->TileMode].LogicalTileHeight;
        if (uVar5 == 1) {
          uVar6 = uVar2;
          uVar2 = 0;
        }
        uVar7 = uVar7 + uVar2;
        break;
      }
      uVar3 = (*(this->super_GmmGen11TextureCalc).super_GmmGen10TextureCalc.super_GmmGen9TextureCalc
                .super_GmmTextureCalc._vptr_GmmTextureCalc[0x19])(this,pTexInfo,(ulong)uVar5);
      uVar2 = 1;
      if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) != 0) {
        uVar2 = (pTexInfo->MSAA).NumSamples;
      }
      uVar2 = GmmTextureCalc::ExpandHeight((GmmTextureCalc *)this,uVar3,(uint32_t)local_50,uVar2);
      if (local_31 != '\0') {
        uVar2 = uVar2 / local_38;
      }
      uVar3 = uVar2;
      if (uVar5 == 1) {
        uVar3 = 0;
        uVar6 = uVar2;
      }
      uVar7 = uVar7 + uVar3;
    }
    if (((ulong)aVar1 & 0x106000000000) == 0) {
      if (uVar6 < uVar7) {
        uVar6 = uVar7;
      }
      _CompressWidth = (ulong)((int)_CompressWidth + ((int)local_50 + -1 + uVar6 & -(int)local_50));
    }
    else {
      if (uVar7 < uVar6) {
        uVar7 = uVar6;
      }
      uVar2 = local_48->TileInfo[pTexInfo->TileMode].LogicalTileHeight;
      _CompressWidth = (ulong)(-uVar2 & (uVar2 - 1) + (int)_CompressWidth + uVar7);
    }
  }
  return (uint32_t)_CompressWidth;
}

Assistant:

uint32_t GmmLib::GmmGen12TextureCalc::Get2DMipMapHeight(GMM_TEXTURE_INFO *pTexInfo)
{
    uint32_t BlockHeight, MipHeight;
    uint32_t HeightLinesLevel0, HeightLinesLevel1, HeightLinesLevel2;
    uint32_t i, MipLevel, VAlign, CompressHeight, CompressWidth, CompressDepth;
    uint8_t  Compressed;
    GMM_DPF_ENTER;

    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    Compressed = GmmIsCompressed(pGmmLibContext, pTexInfo->Format);
    MipHeight  = pTexInfo->BaseHeight;
    MipLevel   = pTexInfo->MaxLod;
    VAlign     = pTexInfo->Alignment.VAlign;
    GetCompressionBlockDimensions(pTexInfo->Format, &CompressWidth, &CompressHeight, &CompressDepth);

    HeightLinesLevel0 = __GMM_EXPAND_HEIGHT(this, MipHeight, VAlign, pTexInfo);

    if(Compressed)
    {
        HeightLinesLevel0 /= CompressHeight;
    }

    // Mip0 height...
    BlockHeight = HeightLinesLevel0;

    if((pTexInfo->Flags.Info.TiledYf || GMM_IS_64KB_TILE(pTexInfo->Flags)) &&
       ((pTexInfo->Alignment.MipTailStartLod == 0) || (pTexInfo->MaxLod == 0)))
    {
        // Do nothing. Height is already aligned.
    }
    else
    {
        // Height of Mip1 and Mip2..n needed later...
        HeightLinesLevel1 = HeightLinesLevel2 = 0;
        for(i = 1; i <= MipLevel; i++)
        {
            uint32_t AlignedHeightLines;

            if((pTexInfo->Flags.Info.TiledYf || GMM_IS_64KB_TILE(pTexInfo->Flags)) &&
               (i == pTexInfo->Alignment.MipTailStartLod))
            {
                AlignedHeightLines = pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileHeight;

                if(i == 1)
                {
                    HeightLinesLevel1 = AlignedHeightLines;
                }
                else
                {
                    HeightLinesLevel2 += AlignedHeightLines;
                }

                break;
            }
            else
            {
                MipHeight = GmmTexGetMipHeight(pTexInfo, i);

                AlignedHeightLines = __GMM_EXPAND_HEIGHT(this, MipHeight, VAlign, pTexInfo);

                if(Compressed)
                {
                    AlignedHeightLines /= CompressHeight;
                }

                if(i == 1)
                {
                    HeightLinesLevel1 = AlignedHeightLines;
                }
                else
                {
                    HeightLinesLevel2 += AlignedHeightLines;
                }
            }
        }

        // If Mip1 height covers all others, then that is all we need...
        if(!(pTexInfo->Flags.Info.TiledYf || GMM_IS_64KB_TILE(pTexInfo->Flags)))
        {
            if(HeightLinesLevel1 >= HeightLinesLevel2)
            {
                BlockHeight += GFX_ALIGN(HeightLinesLevel1, VAlign);
            }
            else
            {
                BlockHeight += GFX_ALIGN(HeightLinesLevel2, VAlign);
            }
        }
        else
        {
            //TR mode- requires TileMode height alignment
            BlockHeight += (HeightLinesLevel1 >= HeightLinesLevel2) ? HeightLinesLevel1 : HeightLinesLevel2;
            BlockHeight = GFX_ALIGN(BlockHeight, pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileHeight);
        }
    }

    GMM_DPF_EXIT;

    return (BlockHeight);
}